

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_wallmarks.cxx
# Opt level: O3

void __thiscall xray_re::xr_level_wallmarks::save(xr_level_wallmarks *this,xr_writer *w)

{
  pointer ppwVar1;
  undefined4 in_EAX;
  pointer ppwVar2;
  undefined4 uStack_28;
  undefined4 local_24;
  
  uStack_28 = in_EAX;
  xr_writer::open_chunk(w,1);
  _uStack_28 = CONCAT44((int)((ulong)((long)(this->m_slots).
                                            super__Vector_base<xray_re::wm_slot_*,_std::allocator<xray_re::wm_slot_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_slots).
                                           super__Vector_base<xray_re::wm_slot_*,_std::allocator<xray_re::wm_slot_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3),
                        uStack_28);
  (*w->_vptr_xr_writer[2])(w,&local_24,4);
  ppwVar2 = (this->m_slots).
            super__Vector_base<xray_re::wm_slot_*,_std::allocator<xray_re::wm_slot_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppwVar1 = (this->m_slots).
            super__Vector_base<xray_re::wm_slot_*,_std::allocator<xray_re::wm_slot_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppwVar2 != ppwVar1) {
    do {
      write_wm_slot::operator()((write_wm_slot *)((long)&uStack_28 + 3),*ppwVar2,w);
      ppwVar2 = ppwVar2 + 1;
    } while (ppwVar2 != ppwVar1);
  }
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_level_wallmarks::save(xr_writer& w) const
{
	w.open_chunk(1);
	w.w_size_u32(m_slots.size());
	w.w_seq(m_slots, write_wm_slot());
	w.close_chunk();
}